

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O1

void __thiscall
capnp::compiler::NodeTranslator::StructTranslator::MemberInfo::finishGroup(MemberInfo *this)

{
  Union *pUVar1;
  void *pvVar2;
  WirePointer *pWVar3;
  uint uVar4;
  WirePointer WVar5;
  Fault local_50;
  Builder local_48;
  
  pUVar1 = (this->field_21).unionScope;
  if (pUVar1 != (Union *)0x0) {
    if ((pUVar1->discriminantOffset).ptr.isSet == false) {
      uVar4 = (*pUVar1->parent->_vptr_StructOrGroup[1])(pUVar1->parent,4);
      if ((pUVar1->discriminantOffset).ptr.isSet == true) {
        (pUVar1->discriminantOffset).ptr.isSet = false;
      }
      (pUVar1->discriminantOffset).ptr.field_1.value = uVar4;
      (pUVar1->discriminantOffset).ptr.isSet = true;
    }
    pvVar2 = (this->node)._builder.data;
    *(short *)((long)pvVar2 + 0x1e) = (short)this->unionDiscriminantCount;
    if ((((this->field_21).unionScope)->discriminantOffset).ptr.isSet == false) {
      local_50.exception = (Exception *)0x0;
      local_48._builder.segment = (SegmentBuilder *)0x0;
      local_48._builder.capTable = (CapTableBuilder *)0x0;
      kj::_::Debug::Fault::init
                (&local_50,
                 (EVP_PKEY_CTX *)
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/node-translator.c++"
                );
      kj::_::Debug::Fault::fatal(&local_50);
    }
    *(anon_union_4_1_a8c68091_for_NullableValue<unsigned_int>_2 *)((long)pvVar2 + 0x20) =
         (((this->field_21).unionScope)->discriminantOffset).ptr.field_1;
  }
  if (this->parent != (MemberInfo *)0x0) {
    WVar5 = (WirePointer)generateGroupId(*(this->parent->node)._builder.data,(uint16_t)this->index);
    pWVar3 = (WirePointer *)(this->node)._builder.data;
    *pWVar3 = WVar5;
    pWVar3[2] = *(WirePointer *)(this->parent->node)._builder.data;
    getSchema(&local_48,this);
    *(undefined2 *)&(((WirePointer *)((long)local_48._builder.data + 8))->offsetAndKind).value = 1;
    ((WirePointer *)((long)local_48._builder.data + 0x10))->offsetAndKind = 0;
    ((WirePointer *)((long)local_48._builder.data + 0x10))->field_1 =
         (anon_union_4_5_35ddcec3_for_WirePointer_1)0x0;
    *(WirePointer *)((long)local_48._builder.data + 0x10) = WVar5;
    *(WirePointer *)(this->sourceInfo)._builder.data = WVar5;
    if ((this->docComment).ptr.isSet == true) {
      local_48._builder.segment = (this->sourceInfo)._builder.segment;
      local_48._builder.capTable = (this->sourceInfo)._builder.capTable;
      local_48._builder.data = (this->sourceInfo)._builder.pointers;
      capnp::_::PointerBuilder::setBlob<capnp::Text>
                ((PointerBuilder *)&local_48,
                 (Reader)(this->docComment).ptr.field_1.value.super_StringPtr.content);
    }
  }
  return;
}

Assistant:

void finishGroup() {
      if (unionScope != nullptr) {
        unionScope->addDiscriminant();  // if it hasn't happened already
        auto structNode = node.getStruct();
        structNode.setDiscriminantCount(unionDiscriminantCount);
        structNode.setDiscriminantOffset(KJ_ASSERT_NONNULL(unionScope->discriminantOffset));
      }

      if (parent != nullptr) {
        uint64_t groupId = generateGroupId(parent->node.getId(), index);
        node.setId(groupId);
        node.setScopeId(parent->node.getId());
        getSchema().initGroup().setTypeId(groupId);

        sourceInfo.setId(groupId);
        KJ_IF_MAYBE(dc, docComment) {
          sourceInfo.setDocComment(*dc);
        }
      }
    }